

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

int __thiscall
glslang::TDefaultIoResolverBase::resolveUniformLocation
          (TDefaultIoResolverBase *this,EShLanguage param_1,TVarEntryInfo *ent)

{
  char *nameStr;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TTypeList *pTVar3;
  undefined4 in_register_00000034;
  TType *this_00;
  
  iVar1 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                    (ent->symbol,CONCAT44(in_register_00000034,param_1));
  this_00 = (TType *)CONCAT44(extraout_var,iVar1);
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  iVar1 = -1;
  if (this->referenceIntermediate->autoMapLocations == true) {
    nameStr = *(char **)(CONCAT44(extraout_var_00,iVar2) + 8);
    iVar2 = (*this_00->_vptr_TType[0xb])(this_00);
    if ((~*(uint *)(CONCAT44(extraout_var_01,iVar2) + 0x1c) & 0xfff) == 0) {
      iVar2 = (*this_00->_vptr_TType[0x29])(this_00);
      if ((char)iVar2 == '\0') {
        iVar2 = (*this_00->_vptr_TType[7])(this_00);
        if ((iVar2 != 0x10) && (this_00->field_0x8 != '\r')) {
          iVar2 = (*this_00->_vptr_TType[7])(this_00);
          if (iVar2 != 0x1a) {
            iVar2 = (*this_00->_vptr_TType[0x36])(this_00);
            if (((char)iVar2 == '\0') || ((this->referenceIntermediate->spvVersion).openGl != 0)) {
              iVar2 = (*this_00->_vptr_TType[0x25])(this_00);
              if ((char)iVar2 != '\0') {
                pTVar3 = TType::getStruct(this_00);
                if ((pTVar3->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    (pTVar3->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_start) goto LAB_003e9386;
                pTVar3 = TType::getStruct(this_00);
                iVar2 = (*((pTVar3->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[0x29])();
                if ((char)iVar2 != '\0') goto LAB_003e9386;
              }
              iVar1 = TIntermediate::getUniformLocationOverride(this->referenceIntermediate,nameStr)
              ;
              if (iVar1 == -1) {
                iVar1 = this->nextUniformLocation;
                iVar2 = TIntermediate::computeTypeUniformLocationSize(this_00);
                this->nextUniformLocation = this->nextUniformLocation + iVar2;
              }
            }
          }
        }
      }
    }
  }
LAB_003e9386:
  ent->newLocation = iVar1;
  return iVar1;
}

Assistant:

int TDefaultIoResolverBase::resolveUniformLocation(EShLanguage /*stage*/, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    const char* name =  ent.symbol->getAccessName().c_str();
    // kick out of not doing this
    if (! doAutoLocationMapping()) {
        return ent.newLocation = -1;
    }
    // no locations added if already present, a built-in variable, a block, or an opaque
    if (type.getQualifier().hasLocation() || type.isBuiltIn() || type.getBasicType() == EbtBlock ||
        type.isAtomic() || type.isSpirvType() || (type.containsOpaque() && referenceIntermediate.getSpv().openGl == 0)) {
        return ent.newLocation = -1;
    }
    // no locations on blocks of built-in variables
    if (type.isStruct()) {
        if (type.getStruct()->size() < 1) {
            return ent.newLocation = -1;
        }
        if ((*type.getStruct())[0].type->isBuiltIn()) {
            return ent.newLocation = -1;
        }
    }
    int location = referenceIntermediate.getUniformLocationOverride(name);
    if (location != -1) {
        return ent.newLocation = location;
    }
    location = nextUniformLocation;
    nextUniformLocation += TIntermediate::computeTypeUniformLocationSize(type);
    return ent.newLocation = location;
}